

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

int __thiscall polyscope::Group::isEnabled(Group *this)

{
  pointer pWVar1;
  pointer pWVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  WeakHandle<polyscope::Structure> *childWeak;
  pointer this_00;
  pointer this_01;
  byte bVar9;
  
  cullExpiredChildren(this);
  pWVar1 = (this->childrenStructures).
           super__Vector_base<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  bVar9 = 0;
  for (this_00 = (this->childrenStructures).
                 super__Vector_base<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pWVar1; this_00 = this_00 + 1
      ) {
    bVar4 = GenericWeakHandle::isValid(&this_00->super_GenericWeakHandle);
    if (bVar4) {
      bVar4 = Structure::isEnabled(this_00->targetPtr);
      if (!bVar4) {
        bVar3 = true;
      }
      bVar9 = bVar9 | bVar4;
    }
  }
  this_01 = (this->childrenGroups).
            super__Vector_base<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->childrenGroups).
           super__Vector_base<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_01 == pWVar2) {
      uVar6 = (uint)(byte)~bVar3;
      if (bVar9 == 0) {
        uVar6 = 0;
      }
      uVar8 = 0xffffffff;
      if (!bVar3) {
        uVar8 = uVar6;
      }
      uVar6 = 0;
      if (bVar9 != 0) {
        uVar6 = uVar8;
      }
      uVar7 = 0xfffffffe;
      if (bVar3) {
        uVar7 = uVar6;
      }
      if (bVar9 != 0) {
        uVar7 = uVar8;
      }
      return uVar7;
    }
    bVar4 = GenericWeakHandle::isValid(&this_01->super_GenericWeakHandle);
    if (bVar4) break;
    this_01 = this_01 + 1;
  }
  iVar5 = isEnabled(this_01->targetPtr);
  iVar5 = (*(code *)(&DAT_002c2014 + *(int *)(&DAT_002c2014 + (ulong)(iVar5 + 2) * 4)))();
  return iVar5;
}

Assistant:

int Group::isEnabled() {

  // return values:
  // 0: all children disabled
  // 1: all children enabled
  // -1: some children enabled, some disabled
  // -2: no children
  // (these -2 groups should not have a checkbox in the UI - there's nothing to enable / disable -
  // unless we added a is_enabled state for empty groups, but this could lead to edge cases)

  cullExpiredChildren();

  bool any_children_enabled = false;
  bool any_children_disabled = false;
  // check all structure children

  for (WeakHandle<Structure>& childWeak : childrenStructures) {
    if (childWeak.isValid()) {
      Structure& child = childWeak.get();
      if (child.isEnabled()) {
        any_children_enabled = true;
      } else {
        any_children_disabled = true;
      }
    }
  }

  // check all group children
  for (WeakHandle<Group>& groupWeak : childrenGroups) {
    if (groupWeak.isValid()) {
      Group& group = groupWeak.get();
      switch (group.isEnabled()) {
      case 1:
        any_children_enabled = true;
        break;
      case 0:
        any_children_disabled = true;
        break;
      case -1:
        any_children_enabled = true;
        any_children_disabled = true;
        break;
      case -2:
        break;
      default:
        exception("Unexpected return value from Group::isEnabled()");
      }
    }
  }

  int result = 0;
  if (!any_children_enabled && any_children_disabled) {
    result = 0;
  }
  if (any_children_enabled && !any_children_disabled) {
    result = 1;
  }
  if (any_children_enabled && any_children_disabled) {
    result = -1;
  }
  if (!any_children_enabled && !any_children_disabled) {
    result = -2;
  }
  return result;
}